

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float fVar2;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  ImFont *pIVar9;
  bool bVar10;
  int iVar11;
  ImFontAtlasCustomRect *pIVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  size_t __n;
  int iVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  size_t local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ulong local_48;
  ImFontAtlasCustomRect *local_40;
  ulong local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xace,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar12 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar4 = pIVar12->X;
  if (uVar4 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa5d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar12->Width != 0xd9) || (pIVar12->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa63,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar12->Width != 2) || (pIVar12->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa74,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar21 = atlas->TexWidth;
    iVar11 = (uint)pIVar12->Y * iVar21 + (uint)uVar4;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar17 = atlas->TexPixelsRGBA32;
      puVar1 = puVar17 + (iVar21 + iVar11);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar17 = puVar17 + iVar11;
      puVar17[0] = 0xffffffff;
      puVar17[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar21 + iVar11) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar21 + iVar11] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar11] = 0xff;
    }
  }
  uVar16._0_2_ = pIVar12->X;
  uVar16._2_2_ = pIVar12->Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar16 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar16 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    local_40 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar4 = local_40->X;
    if (uVar4 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa89,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar23 = -0x40;
    iVar21 = 0;
    uVar14 = 0;
    do {
      uVar16 = (uint)uVar4;
      if ((ulong)local_40->Height <= lVar23 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xa93,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar4 = local_40->Width;
      uVar13 = (int)uVar14 + (uint)uVar4;
      uVar15 = uVar13 >> 1;
      iVar11 = (int)lVar23;
      uVar19 = iVar11 + uVar15 + 0x40;
      iVar20 = (uVar4 - uVar15) + (int)uVar14;
      puVar7 = atlas->TexPixelsAlpha8;
      local_38 = uVar14;
      if (puVar7 == (uchar *)0x0) {
        puVar17 = atlas->TexPixelsRGBA32;
        uVar5 = local_40->Y;
        iVar6 = atlas->TexWidth;
        puVar1 = puVar17 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + uVar16);
        if (1 < uVar13) {
          memset(puVar1,0,(ulong)(uVar15 + (uVar15 == 0)) << 2);
        }
        if (lVar23 != -0x40) {
          memset(puVar1 + uVar15,0xff,local_60);
        }
        if (uVar19 != uVar4) {
          puVar17 = puVar17 + (ulong)(iVar6 * ((uint)uVar5 + iVar21) + uVar16) +
                              (ulong)uVar15 + lVar23 + 0x40;
          __n = (ulong)(iVar20 + (uint)(iVar20 == 0)) << 2;
          goto LAB_001370d5;
        }
      }
      else {
        uVar5 = local_40->Y;
        local_48 = (ulong)uVar5;
        iVar6 = atlas->TexWidth;
        if (1 < uVar13) {
          memset(puVar7 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + uVar16),0,
                 (ulong)(uVar15 + (uVar15 == 0)));
        }
        if (lVar23 != -0x40) {
          memset(puVar7 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + uVar16) + uVar15,0xff,
                 lVar23 + 0x40U);
        }
        if (uVar19 != uVar4) {
          puVar17 = (uint *)(puVar7 + lVar23 + (ulong)(iVar6 * ((int)local_48 + iVar21) + uVar16) +
                                               (ulong)uVar15 + 0x40);
          __n = (size_t)(iVar20 + (uint)(iVar20 == 0));
LAB_001370d5:
          memset(puVar17,0,__n);
        }
      }
      uVar4 = local_40->X;
      uVar5 = local_40->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar24 = (atlas->TexUvScale).y;
      (&atlas->TexUvLines[0].x)[local_60] = (float)((uVar15 + uVar4) - 1) * fVar2;
      fVar24 = ((float)(int)(iVar11 + 0x41 + (uint)uVar5) * fVar24 +
               (float)(int)(iVar11 + 0x40 + (uint)uVar5) * fVar24) * 0.5;
      *(ulong *)(&atlas->TexUvLines[0].y + local_60) =
           CONCAT44(fVar2 * (float)(iVar11 + uVar15 + uVar4 + 0x41),fVar24);
      (&atlas->TexUvLines[0].w)[local_60] = fVar24;
      uVar14 = (ulong)((int)local_38 - 1);
      iVar21 = iVar21 + 1;
      local_60 = local_60 + 4;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0);
  }
  iVar21 = (atlas->CustomRects).Size;
  if (0 < iVar21) {
    lVar23 = 0;
    lVar22 = 0;
    do {
      pIVar12 = (atlas->CustomRects).Data;
      lVar8 = *(long *)((long)&pIVar12->Font + lVar23);
      if ((lVar8 != 0) && (*(int *)((long)&pIVar12->GlyphID + lVar23) != 0)) {
        if (*(ImFontAtlas **)(lVar8 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                        ,0xada,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_50.x = 0.0;
        local_50.y = 0.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar12->Width + lVar23),&local_50,
                   &local_58);
        fVar2 = *(float *)((long)&(pIVar12->GlyphOffset).x + lVar23);
        fVar24 = *(float *)((long)&(pIVar12->GlyphOffset).y + lVar23);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar12->Font + lVar23),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar12->GlyphID + lVar23),fVar2,fVar24,
                         (float)*(ushort *)((long)&pIVar12->Width + lVar23) + fVar2,
                         (float)*(ushort *)((long)&pIVar12->Height + lVar23) + fVar24,local_50.x,
                         local_50.y,local_58.x,local_58.y,
                         *(float *)((long)&pIVar12->GlyphAdvanceX + lVar23));
        iVar21 = (atlas->CustomRects).Size;
      }
      lVar22 = lVar22 + 1;
      lVar23 = lVar23 + 0x20;
    } while (lVar22 < iVar21);
  }
  uVar16 = (atlas->Fonts).Size;
  if (0 < (int)uVar16) {
    lVar23 = 0;
    do {
      pIVar9 = (atlas->Fonts).Data[lVar23];
      if (pIVar9->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar9);
        uVar16 = (atlas->Fonts).Size;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < (int)uVar16);
    if (0 < (int)uVar16) {
      uVar14 = 0;
      do {
        if ((long)(atlas->Fonts).Size <= (long)uVar14) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
        }
        pIVar9 = (atlas->Fonts).Data[uVar14];
        if (pIVar9->EllipsisChar == 0xffff) {
          lVar23 = 0;
          bVar10 = true;
          do {
            bVar18 = bVar10;
            uVar4 = (&DAT_0019fd74)[lVar23];
            if ((((ulong)uVar4 < (ulong)(long)(pIVar9->IndexLookup).Size) &&
                ((pIVar9->IndexLookup).Data[uVar4] != 0xffff)) &&
               ((pIVar9->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar9->EllipsisChar = uVar4;
              break;
            }
            lVar23 = 1;
            bVar10 = false;
          } while (bVar18);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar16);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}